

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

Rect __thiscall SkylineBinPack::Insert(SkylineBinPack *this,int width,int height)

{
  DisjointRectCollection *this_00;
  uint __line;
  bool bVar1;
  char *__assertion;
  Rect RVar2;
  Rect node;
  Rect local_30;
  
  node = GuillotineBinPack::Insert
                   (&this->wasteMap,width,height,true,RectBestShortSideFit,SplitMaximizeArea);
  this_00 = &this->disjointRects;
  bVar1 = DisjointRectCollection::Disjoint(this_00,&node);
  RVar2 = node;
  if (!bVar1) {
    __assertion = "disjointRects.Disjoint(node)";
    __line = 0x6d;
LAB_0032578b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,__line,"Rect SkylineBinPack::Insert(int, int)");
  }
  if (node.height == 0) {
    RVar2 = InsertBottomLeft(this,width,height);
  }
  else {
    local_30.x = node.x;
    local_30.y = node.y;
    node.width = RVar2.width;
    local_30.width = node.width;
    local_30.height = node.height;
    this->usedSurfaceArea = this->usedSurfaceArea + (long)(height * width);
    node = RVar2;
    bVar1 = DisjointRectCollection::Disjoint(this_00,&local_30);
    if (!bVar1) {
      __assertion = "disjointRects.Disjoint(newNode)";
      __line = 0x79;
      goto LAB_0032578b;
    }
    DisjointRectCollection::Add(this_00,&local_30);
    RVar2.width = local_30.width;
    RVar2.x = local_30.x;
    RVar2.y = local_30.y;
    RVar2.height = local_30.height;
  }
  return RVar2;
}

Assistant:

Rect SkylineBinPack::Insert(int width, int height)
{
	// First try to pack this rectangle into the waste map, if it fits.
	Rect node = wasteMap.Insert(width, height, true, GuillotineBinPack::RectBestShortSideFit, 
		GuillotineBinPack::SplitMaximizeArea);
#ifdef _DEBUG
	assert(disjointRects.Disjoint(node));
#endif

	if (node.height != 0)
	{
		Rect newNode;
		newNode.x = node.x;
		newNode.y = node.y;
		newNode.width = node.width;
		newNode.height = node.height;
		usedSurfaceArea += width * height;
#ifdef _DEBUG
		assert(disjointRects.Disjoint(newNode));
		disjointRects.Add(newNode);
#endif
		return newNode;
	}
	
	return InsertBottomLeft(width, height);
}